

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O2

void __thiscall sparse_square_matrix<bool>::recreate(sparse_square_matrix<bool> *this,uint32_t n)

{
  uint uVar1;
  
  this->N = n;
  (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->sparseStorage)._M_h);
  uVar1 = this->N;
  if (uVar1 < 0x2000) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->denseStorage,(ulong)(uVar1 * uVar1),false);
    return;
  }
  return;
}

Assistant:

void recreate(uint32_t n) {
    N = n;
    denseStorage.clear();
    sparseStorage.clear();
    if (N < DenseLimit) {
      denseStorage.resize(N * N);
    }
  }